

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageFetchComputeInstance::logTestPlan
          (ImageFetchComputeInstance *this)

{
  ostream *poVar1;
  char *pcVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  char *local_378;
  char *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  MessageBuilder local_328;
  int local_1a8;
  undefined1 local_1a4 [4];
  int srcResourceNdx;
  ChannelOrder local_198;
  int resultNdx;
  ostringstream local_188 [8];
  ostringstream msg;
  ImageFetchComputeInstance *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"Fetching 4 values from image in compute shader.\n")
  ;
  poVar1 = std::operator<<(poVar1,"Single descriptor set. Descriptor set contains ");
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_370 = "single";
  }
  else {
    if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      local_378 = "two";
    }
    else {
      local_378 = (char *)0x0;
      if (this->m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        local_378 = "an array (size 2) of";
      }
    }
    local_370 = local_378;
  }
  poVar1 = std::operator<<(poVar1,local_370);
  poVar1 = std::operator<<(poVar1," descriptor(s) of type ");
  pcVar2 = ::vk::getDescriptorTypeName(this->m_descriptorType);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Image view type is ");
  pcVar2 = ::vk::getImageViewTypeName(this->m_viewType);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\n");
  if (this->m_baseMipLevel != 0) {
    poVar1 = std::operator<<((ostream *)local_188,"Image view base mip level = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_baseMipLevel);
    std::operator<<(poVar1,"\n");
  }
  if (this->m_baseArraySlice != 0) {
    poVar1 = std::operator<<((ostream *)local_188,"Image view base array slice = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_baseArraySlice);
    std::operator<<(poVar1,"\n");
  }
  for (local_198 = R; (int)local_198 < 4; local_198 = local_198 + A) {
    poVar1 = std::operator<<((ostream *)local_188,"Test sample ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_198);
    poVar1 = std::operator<<(poVar1,": fetch at position ");
    ImageFetchInstanceImages::getFetchPos
              ((ImageFetchInstanceImages *)local_1a4,this->m_viewType,this->m_baseMipLevel,
               this->m_baseArraySlice,local_198);
    tcu::operator<<(poVar1,(Vector<int,_3> *)local_1a4);
    if (this->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      local_1a8 = (int)local_198 % 2;
      poVar1 = std::operator<<((ostream *)local_188," from descriptor ");
      std::ostream::operator<<(poVar1,local_1a8);
    }
    std::operator<<((ostream *)local_188,"\n");
  }
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_328,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::ostringstream::str();
  this_02 = tcu::MessageBuilder::operator<<(&local_328,&local_348);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_348);
  tcu::MessageBuilder::~MessageBuilder(&local_328);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void ImageFetchComputeInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Fetching 4 values from image in compute shader.\n"
		<< "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
		<< " descriptor(s) of type " << vk::getDescriptorTypeName(m_descriptorType) << "\n"
		<< "Image view type is " << vk::getImageViewTypeName(m_viewType) << "\n";

	if (m_baseMipLevel)
		msg << "Image view base mip level = " << m_baseMipLevel << "\n";
	if (m_baseArraySlice)
		msg << "Image view base array slice = " << m_baseArraySlice << "\n";

	for (int resultNdx = 0; resultNdx < 4; ++resultNdx)
	{
		msg << "Test sample " << resultNdx << ": fetch at position " << m_images.getFetchPos(m_viewType, m_baseMipLevel, m_baseArraySlice, resultNdx);

		if (m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR)
		{
			const int srcResourceNdx = (resultNdx % 2); // ABAB source
			msg << " from descriptor " << srcResourceNdx;
		}

		msg << "\n";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}